

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O3

void duckdb::FixedSizeFetchRow<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  undefined8 uVar4;
  BufferManager *pBVar5;
  unsigned_long uVar6;
  BufferHandle handle;
  BufferHandle local_40;
  
  pBVar5 = BufferManager::GetBufferManager(segment->db);
  (*pBVar5->_vptr_BufferManager[7])(&local_40,pBVar5,&segment->block);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_40.node);
  pdVar1 = (local_40.node.ptr)->buffer;
  iVar2 = segment->offset;
  uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  pdVar3 = result->data;
  uVar4 = *(undefined8 *)(pdVar1 + uVar6 * 0x10 + iVar2 + 8);
  *(undefined8 *)(pdVar3 + result_idx * 0x10) = *(undefined8 *)(pdVar1 + uVar6 * 0x10 + iVar2);
  *(undefined8 *)(pdVar3 + result_idx * 0x10 + 8) = uVar4;
  BufferHandle::~BufferHandle(&local_40);
  return;
}

Assistant:

void FixedSizeFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                       idx_t result_idx) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);

	// first fetch the data from the base table
	auto data_ptr = handle.Ptr() + segment.GetBlockOffset() + NumericCast<idx_t>(row_id) * sizeof(T);

	memcpy(FlatVector::GetData(result) + result_idx * sizeof(T), data_ptr, sizeof(T));
}